

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void update_loss_alarm(quicly_conn_t *conn,int is_after_send)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  quicly_loss_conf_t *pqVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  if ((conn->egress).loss.sentmap.bytes_in_flight == 0) {
    bVar12 = ((uint)(conn->super).remote.address_validation & 2) == 0;
  }
  else {
    bVar12 = false;
  }
  bVar13 = true;
  if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
    bVar13 = conn->handshake != (st_quicly_handshake_space_t *)0x0;
  }
  lVar3 = (conn->stash).now;
  lVar7 = (conn->egress).last_retransmittable_sent_at;
  iVar5 = scheduler_can_send(conn);
  if (bVar12) {
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    lVar7 = 0x610;
    lVar10 = 0x7fffffffffffffff;
  }
  else {
    if (lVar7 == 0x7fffffffffffffff) {
      __assert_fail("last_retransmittable_sent_at != INT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x101,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
    lVar10 = (conn->egress).loss.loss_time;
    if (lVar10 == 0x7fffffffffffffff) {
      cVar1 = (conn->egress).loss.pto_count;
      if ('>' < cVar1) {
        __assert_fail("r->pto_count < 63",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x116,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      pqVar4 = (conn->egress).loss.conf;
      if (((pqVar4->num_speculative_ptos != '\0') && ((iVar5 == 0 && !bVar13) && cVar1 < '\x01')) &&
         (uVar11 = (conn->egress).max_data.sent, (conn->egress).loss.total_bytes_sent < uVar11)) {
        if (cVar1 == '\0') {
          (conn->egress).loss.pto_count = -pqVar4->num_speculative_ptos;
        }
        (conn->egress).loss.total_bytes_sent = uVar11;
      }
      bVar2 = (conn->egress).loss.pto_count;
      if ((char)bVar2 < '\0') {
        uVar8 = pqVar4->min_pto;
        uVar6 = (conn->egress).loss.rtt.variance;
        uVar9 = uVar6 * 4;
        if (uVar6 == 0) {
          uVar9 = uVar8;
        }
        uVar11 = (ulong)(uVar9 + (conn->egress).loss.rtt.smoothed >> (-bVar2 & 0x3f));
        if (uVar11 <= uVar8) {
          uVar11 = (ulong)uVar8;
        }
      }
      else {
        uVar8 = 0;
        if (!bVar13) {
          uVar8 = (uint)*(conn->egress).loss.max_ack_delay;
        }
        uVar6 = (conn->egress).loss.rtt.variance;
        if (uVar6 == 0) {
          uVar6 = pqVar4->min_pto;
        }
        else {
          uVar6 = uVar6 << 2;
        }
        uVar11 = (ulong)(uVar8 + (conn->egress).loss.rtt.smoothed + uVar6) << (bVar2 & 0x3f);
      }
      lVar10 = uVar11 + lVar7;
      if (is_after_send != 0) {
        lVar7 = 0x618;
        if (lVar10 <= lVar3) {
          __assert_fail("now < _t",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                        ,0x138,
                        "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                       );
        }
        goto LAB_001231cf;
      }
    }
    else if (is_after_send != 0) {
      lVar7 = 0x618;
      if (lVar10 <= lVar3) {
        __assert_fail("now < _t",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x110,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      goto LAB_001231cf;
    }
    if (lVar10 <= lVar3) {
      lVar10 = lVar3;
    }
    lVar7 = 0x618;
  }
LAB_001231cf:
  *(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar7 + -0x30) = lVar10;
  return;
}

Assistant:

static void update_loss_alarm(quicly_conn_t *conn, int is_after_send)
{
    int has_outstanding = conn->egress.loss.sentmap.bytes_in_flight != 0 || conn->super.remote.address_validation.send_probe,
        handshake_is_in_progress = conn->initial != NULL || conn->handshake != NULL;
    quicly_loss_update_alarm(&conn->egress.loss, conn->stash.now, conn->egress.last_retransmittable_sent_at, has_outstanding,
                             scheduler_can_send(conn), handshake_is_in_progress, conn->egress.max_data.sent, is_after_send);
}